

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIService.h
# Opt level: O0

void libchess::UCIService::bestmove
               (string *move,
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *ponder_move,ostream *out)

{
  bool bVar1;
  ostream *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char *in_RDI;
  string bestmove_str;
  string asStack_58 [32];
  string local_38 [32];
  ostream *local_18;
  
  local_18 = in_RDX;
  std::operator+(in_RDI,in_RSI);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x123285);
  if (bVar1) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x123295);
    std::operator+(in_RDI,in_RSI);
    std::__cxx11::string::operator+=(local_38,asStack_58);
    std::__cxx11::string::~string(asStack_58);
  }
  std::__cxx11::string::operator+=(local_38,"\n");
  std::operator<<(local_18,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

static void bestmove(const std::string& move,
                         const std::optional<std::string>& ponder_move = {},
                         std::ostream& out = std::cout) noexcept {
        std::string bestmove_str = "bestmove " + move;
        if (ponder_move) {
            bestmove_str += " ponder " + *ponder_move;
        }
        bestmove_str += "\n";
        out << bestmove_str;
    }